

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acesup.c
# Opt level: O2

MovePack * acesup_movePackGet(Board *board)

{
  Card *pCVar1;
  byte bVar2;
  MovePack *movePack;
  Spot *pSVar3;
  Spot *pSVar4;
  unsigned_long uVar5;
  Move *pMVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uchar suitTopRanks [4];
  Spot *tableaus [4];
  
  movePack = movePack_create();
  pSVar3 = board_spotGet(board,STOCK,'\0');
  suitTopRanks[0] = '\0';
  suitTopRanks[1] = '\0';
  suitTopRanks[2] = '\0';
  suitTopRanks[3] = '\0';
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    pSVar4 = board_spotGet(board,TABLEAU,(uchar)lVar8);
    tableaus[lVar8] = pSVar4;
    if (pSVar4->cardsCount != 0) {
      pCVar1 = pSVar4->cards[pSVar4->cardsCount - 1];
      for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
        if (uVar7 == pCVar1->suit) {
          bVar2 = pCVar1->rank;
          if (bVar2 == 1) {
            bVar2 = 0xe;
          }
          uVar5 = max((ulong)suitTopRanks[uVar7],(ulong)bVar2);
          suitTopRanks[uVar7] = (uchar)uVar5;
        }
      }
    }
  }
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    bVar2 = tableaus[lVar8]->cardsCount;
    if (bVar2 != 0) {
      pCVar1 = tableaus[lVar8]->cards[bVar2 - 1];
      for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
        bVar2 = pCVar1->rank;
        if (((bVar2 != 1) && (uVar7 == pCVar1->suit)) && (bVar2 < suitTopRanks[uVar7])) {
          pMVar6 = move_create(MOVE,TABLEAU,(uchar)lVar8,-1,FOUNDATION,'\0',-1);
          movePack_add(movePack,pMVar6);
        }
      }
    }
  }
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    if (tableaus[lVar8]->cardsCount != '\0') {
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        if ((lVar8 != lVar9) && (tableaus[lVar9]->cardsCount == '\0')) {
          pMVar6 = move_create(MOVE,TABLEAU,(uchar)lVar8,-1,TABLEAU,(uchar)lVar9,-1);
          movePack_add(movePack,pMVar6);
        }
      }
    }
  }
  if (pSVar3->cardsCount != '\0') {
    pMVar6 = move_create(MOVEDISTRIBUTE,STOCK,'\0',-1,TABLEAU,'\x04',-1);
    movePack_add(movePack,pMVar6);
  }
  return movePack;
}

Assistant:

MovePack * acesup_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	unsigned char i, j;
	Spot * stock = board_spotGet(board, STOCK, 0);
	Spot * tableaus[4];
	unsigned char suitTopRanks[4] = {0,0,0,0};
	Card * card;

	for(i=0;i<4;i++)
	{
		tableaus[i] = board_spotGet(board, TABLEAU, i);
		if(tableaus[i]->cardsCount<1)
			continue;

		card = tableaus[i]->cards[tableaus[i]->cardsCount-1];
		for(j=0;j<4;j++)
		{
			if(card->suit==j)
				suitTopRanks[j] = max(suitTopRanks[j], (card->rank==1 ? 14 : card->rank));
		}
	}

	// Play card to foundation
	for(i=0;i<4;i++)
	{
		if(tableaus[i]->cardsCount<1)
			continue;

		card = tableaus[i]->cards[tableaus[i]->cardsCount-1];
		for(j=0;j<4;j++)
		{
			if(card->rank!=1 && card->suit==j && card->rank<suitTopRanks[j])
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, 0, -1));
		}
	}

	// Tableau to Tableau
	for(i=0;i<4;i++)
	{
		if(tableaus[i]->cardsCount<1)
			continue;

		for(j=0;j<4;j++)
		{
			if(i==j || tableaus[j]->cardsCount>0)
				continue;

			movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, TABLEAU, j, -1));
		}
	}

	// Play stock to tableau
	if(stock->cardsCount>0)
		movePack_add(movePack, move_create(MOVEDISTRIBUTE, STOCK, 0, -1, TABLEAU, 4, -1));

	return movePack;
}